

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s-ref.c
# Opt level: O1

void blake2s_compress(blake2s_state *S,uint8_t *in)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  long in_FS_OFFSET;
  uint32_t m [16];
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  lVar7 = 0;
  do {
    *(undefined4 *)((long)&local_78 + lVar7 * 4) = *(undefined4 *)(in + lVar7 * 4);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  local_a8 = (uint)*(undefined8 *)(S->h + 4);
  local_b8 = (uint)*(undefined8 *)S->h;
  uVar10 = local_b8 + local_a8 + (int)local_78;
  uVar8 = S->t[0] ^ 0x510e527f ^ uVar10;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  local_a8 = uVar8 + 0x6a09e667 ^ local_a8;
  uVar18 = local_a8 << 0x14 | local_a8 >> 0xc;
  uStack_a4 = (uint)((ulong)*(undefined8 *)(S->h + 4) >> 0x20);
  uVar11 = uVar10 + local_78._4_4_ + uVar18;
  uVar10 = uVar11 ^ uVar8;
  uVar15 = uVar10 << 0x18 | uVar10 >> 8;
  uVar4 = uVar15 + uVar8 + 0x6a09e667;
  uVar18 = uVar18 ^ uVar4;
  uVar19 = uVar18 << 0x19 | uVar18 >> 7;
  uVar10 = (int)((ulong)*(undefined8 *)S->h >> 0x20) + uStack_a4 + (int)uStack_70;
  uVar8 = S->t[1] ^ 0x9b05688c ^ uVar10;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uStack_a4 = uVar8 + 0xbb67ae85 ^ uStack_a4;
  uVar9 = uStack_a4 << 0x14 | uStack_a4 >> 0xc;
  uVar18 = uVar10 + uStack_70._4_4_ + uVar9;
  uVar10 = uVar18 ^ uVar8;
  uVar14 = uVar10 << 0x18 | uVar10 >> 8;
  uVar5 = uVar14 + uVar8 + 0xbb67ae85;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uStack_a0 = (uint)*(undefined8 *)(S->h + 6);
  uStack_b0 = (uint)*(undefined8 *)(S->h + 2);
  uVar8 = uStack_b0 + uStack_a0 + (int)local_68;
  uVar10 = S->f[0] ^ 0x1f83d9ab ^ uVar8;
  uVar12 = uVar10 << 0x10 | uVar10 >> 0x10;
  uStack_a0 = uVar12 + 0x3c6ef372 ^ uStack_a0;
  uVar16 = uStack_a0 << 0x14 | uStack_a0 >> 0xc;
  uVar10 = uVar8 + local_68._4_4_ + uVar16;
  uVar8 = uVar10 ^ uVar12;
  uVar21 = uVar8 << 0x18 | uVar8 >> 8;
  uVar13 = uVar21 + uVar12 + 0x3c6ef372;
  uVar16 = uVar16 ^ uVar13;
  uVar17 = uVar16 << 0x19 | uVar16 >> 7;
  uVar8 = (uint)((ulong)*(undefined8 *)(S->h + 6) >> 0x20);
  uVar16 = (int)((ulong)*(undefined8 *)(S->h + 2) >> 0x20) + uVar8 + (int)uStack_60;
  uVar12 = S->f[1] ^ 0x5be0cd19 ^ uVar16;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  uVar8 = uVar12 + 0xa54ff53a ^ uVar8;
  uVar23 = uVar8 << 0x14 | uVar8 >> 0xc;
  uVar16 = uVar16 + uStack_60._4_4_ + uVar23;
  uVar8 = uVar16 ^ uVar12;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar6 = uVar8 + uVar12 + 0xa54ff53a;
  uVar23 = uVar23 ^ uVar6;
  uVar23 = uVar23 << 0x19 | uVar23 >> 7;
  uVar11 = uVar11 + (int)local_58 + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar11 = uVar11 + local_58._4_4_ + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar18 = uVar18 + (int)uStack_50 + uVar17;
  uVar15 = uVar15 ^ uVar18;
  uVar12 = uVar15 << 0x10 | uVar15 >> 0x10;
  uVar6 = uVar6 + uVar12;
  uVar17 = uVar17 ^ uVar6;
  uVar17 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar18 = uVar18 + uStack_50._4_4_ + uVar17;
  uVar12 = uVar12 ^ uVar18;
  uVar15 = uVar12 << 0x18 | uVar12 >> 8;
  uVar6 = uVar6 + uVar15;
  uVar17 = uVar17 ^ uVar6;
  uVar17 = uVar17 << 0x19 | uVar17 >> 7;
  uVar10 = uVar10 + (int)local_48 + uVar23;
  uVar14 = uVar14 ^ uVar10;
  uVar12 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar4 = uVar4 + uVar12;
  uVar23 = uVar23 ^ uVar4;
  uVar23 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar10 = uVar10 + local_48._4_4_ + uVar23;
  uVar12 = uVar12 ^ uVar10;
  uVar14 = uVar12 << 0x18 | uVar12 >> 8;
  uVar4 = uVar4 + uVar14;
  uVar23 = uVar23 ^ uVar4;
  uVar23 = uVar23 << 0x19 | uVar23 >> 7;
  uVar12 = uVar16 + (int)uStack_40 + uVar19;
  uVar21 = uVar21 ^ uVar12;
  uVar21 = uVar21 << 0x10 | uVar21 >> 0x10;
  uVar5 = uVar5 + uVar21;
  uVar19 = uVar19 ^ uVar5;
  uVar16 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar12 = uVar12 + uStack_40._4_4_ + uVar16;
  uVar21 = uVar21 ^ uVar12;
  uVar21 = uVar21 << 0x18 | uVar21 >> 8;
  uVar5 = uVar5 + uVar21;
  uVar16 = uVar16 ^ uVar5;
  uVar19 = uVar16 << 0x19 | uVar16 >> 7;
  uVar11 = uVar11 + (int)uStack_40 + uVar19;
  uVar15 = uVar15 ^ uVar11;
  uVar16 = uVar15 << 0x10 | uVar15 >> 0x10;
  uVar4 = uVar4 + uVar16;
  uVar19 = uVar19 ^ uVar4;
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar11 = uVar11 + (int)uStack_50 + uVar19;
  uVar16 = uVar16 ^ uVar11;
  uVar15 = uVar16 << 0x18 | uVar16 >> 8;
  uVar4 = uVar4 + uVar15;
  uVar19 = uVar19 ^ uVar4;
  uVar19 = uVar19 << 0x19 | uVar19 >> 7;
  uVar18 = uVar18 + (int)local_68 + uVar9;
  uVar14 = uVar14 ^ uVar18;
  uVar16 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar5 = uVar5 + uVar16;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar18 = uVar18 + (int)local_58 + uVar9;
  uVar16 = uVar16 ^ uVar18;
  uVar16 = uVar16 << 0x18 | uVar16 >> 8;
  uVar5 = uVar5 + uVar16;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar10 + local_58._4_4_ + uVar17;
  uVar21 = uVar21 ^ uVar10;
  uVar21 = uVar21 << 0x10 | uVar21 >> 0x10;
  uVar13 = uVar13 + uVar21;
  uVar17 = uVar17 ^ uVar13;
  uVar14 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar10 = uVar10 + uStack_40._4_4_ + uVar14;
  uVar21 = uVar21 ^ uVar10;
  uVar21 = uVar21 << 0x18 | uVar21 >> 8;
  uVar13 = uVar13 + uVar21;
  uVar14 = uVar14 ^ uVar13;
  uVar17 = uVar14 << 0x19 | uVar14 >> 7;
  uVar12 = uVar12 + local_48._4_4_ + uVar23;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar6 = uVar6 + uVar8;
  uVar23 = uVar23 ^ uVar6;
  uVar14 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar12 = uVar12 + (int)uStack_60 + uVar14;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar6 = uVar6 + uVar8;
  uVar14 = uVar14 ^ uVar6;
  uVar23 = uVar14 << 0x19 | uVar14 >> 7;
  uVar11 = uVar11 + local_78._4_4_ + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar11 = uVar11 + (int)local_48 + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar18 = uVar18 + (int)local_78 + uVar17;
  uVar15 = uVar15 ^ uVar18;
  uVar14 = uVar15 << 0x10 | uVar15 >> 0x10;
  uVar6 = uVar6 + uVar14;
  uVar17 = uVar17 ^ uVar6;
  uVar15 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar18 = uVar18 + (int)uStack_70 + uVar15;
  uVar14 = uVar14 ^ uVar18;
  uVar14 = uVar14 << 0x18 | uVar14 >> 8;
  uVar6 = uVar6 + uVar14;
  uVar15 = uVar15 ^ uVar6;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar10 = uVar10 + uStack_50._4_4_ + uVar23;
  uVar16 = uVar16 ^ uVar10;
  uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
  uVar4 = uVar4 + uVar16;
  uVar23 = uVar23 ^ uVar4;
  uVar17 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar10 = uVar10 + uStack_60._4_4_ + uVar17;
  uVar16 = uVar16 ^ uVar10;
  uVar16 = uVar16 << 0x18 | uVar16 >> 8;
  uVar4 = uVar4 + uVar16;
  uVar17 = uVar17 ^ uVar4;
  uVar23 = uVar17 << 0x19 | uVar17 >> 7;
  uVar12 = uVar12 + local_68._4_4_ + uVar19;
  uVar21 = uVar21 ^ uVar12;
  uVar21 = uVar21 << 0x10 | uVar21 >> 0x10;
  uVar5 = uVar5 + uVar21;
  uVar19 = uVar19 ^ uVar5;
  uVar17 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar12 = uVar12 + uStack_70._4_4_ + uVar17;
  uVar21 = uVar21 ^ uVar12;
  uVar19 = uVar21 << 0x18 | uVar21 >> 8;
  uVar5 = uVar5 + uVar19;
  uVar17 = uVar17 ^ uVar5;
  uVar17 = uVar17 << 0x19 | uVar17 >> 7;
  uVar11 = uVar11 + uStack_50._4_4_ + uVar17;
  uVar14 = uVar14 ^ uVar11;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar4 = uVar4 + uVar14;
  uVar17 = uVar17 ^ uVar4;
  uVar17 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar11 = uVar11 + (int)local_58 + uVar17;
  uVar14 = uVar14 ^ uVar11;
  uVar14 = uVar14 << 0x18 | uVar14 >> 8;
  uVar4 = uVar4 + uVar14;
  uVar17 = uVar17 ^ uVar4;
  uVar17 = uVar17 << 0x19 | uVar17 >> 7;
  uVar18 = uVar18 + (int)local_48 + uVar9;
  uVar16 = uVar16 ^ uVar18;
  uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
  uVar5 = uVar5 + uVar16;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar18 = uVar18 + (int)local_78 + uVar9;
  uVar16 = uVar16 ^ uVar18;
  uVar16 = uVar16 << 0x18 | uVar16 >> 8;
  uVar5 = uVar5 + uVar16;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar10 + local_68._4_4_ + uVar15;
  uVar19 = uVar19 ^ uVar10;
  uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
  uVar13 = uVar13 + uVar19;
  uVar15 = uVar15 ^ uVar13;
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar10 = uVar10 + (int)uStack_70 + uVar15;
  uVar19 = uVar19 ^ uVar10;
  uVar19 = uVar19 << 0x18 | uVar19 >> 8;
  uVar13 = uVar13 + uVar19;
  uVar15 = uVar15 ^ uVar13;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar12 = uVar12 + uStack_40._4_4_ + uVar23;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar6 = uVar6 + uVar8;
  uVar23 = uVar23 ^ uVar6;
  uVar21 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar12 = uVar12 + local_48._4_4_ + uVar21;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar6 = uVar6 + uVar8;
  uVar21 = uVar21 ^ uVar6;
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar11 = uVar11 + (int)uStack_50 + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar11 = uVar11 + (int)uStack_40 + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar18 = uVar18 + uStack_70._4_4_ + uVar15;
  uVar14 = uVar14 ^ uVar18;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar6 = uVar6 + uVar14;
  uVar15 = uVar15 ^ uVar6;
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar18 = uVar18 + (int)uStack_60 + uVar15;
  uVar14 = uVar14 ^ uVar18;
  uVar14 = uVar14 << 0x18 | uVar14 >> 8;
  uVar6 = uVar6 + uVar14;
  uVar15 = uVar15 ^ uVar6;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar10 = uVar10 + uStack_60._4_4_ + uVar21;
  uVar16 = uVar16 ^ uVar10;
  uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
  uVar4 = uVar4 + uVar16;
  uVar21 = uVar21 ^ uVar4;
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar10 = uVar10 + local_78._4_4_ + uVar21;
  uVar16 = uVar16 ^ uVar10;
  uVar16 = uVar16 << 0x18 | uVar16 >> 8;
  uVar4 = uVar4 + uVar16;
  uVar21 = uVar21 ^ uVar4;
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar12 = uVar12 + local_58._4_4_ + uVar17;
  uVar19 = uVar19 ^ uVar12;
  uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
  uVar5 = uVar5 + uVar19;
  uVar17 = uVar17 ^ uVar5;
  uVar17 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar12 = uVar12 + (int)local_68 + uVar17;
  uVar19 = uVar19 ^ uVar12;
  uVar19 = uVar19 << 0x18 | uVar19 >> 8;
  uVar5 = uVar5 + uVar19;
  uVar17 = uVar17 ^ uVar5;
  uVar17 = uVar17 << 0x19 | uVar17 >> 7;
  uVar11 = uVar11 + uStack_60._4_4_ + uVar17;
  uVar14 = uVar14 ^ uVar11;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar4 = uVar4 + uVar14;
  uVar17 = uVar17 ^ uVar4;
  uVar17 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar11 = uVar11 + local_58._4_4_ + uVar17;
  uVar14 = uVar14 ^ uVar11;
  uVar14 = uVar14 << 0x18 | uVar14 >> 8;
  uVar4 = uVar4 + uVar14;
  uVar17 = uVar17 ^ uVar4;
  uVar17 = uVar17 << 0x19 | uVar17 >> 7;
  uVar18 = uVar18 + uStack_70._4_4_ + uVar9;
  uVar16 = uVar16 ^ uVar18;
  uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
  uVar5 = uVar5 + uVar16;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar18 = uVar18 + local_78._4_4_ + uVar9;
  uVar16 = uVar16 ^ uVar18;
  uVar16 = uVar16 << 0x18 | uVar16 >> 8;
  uVar5 = uVar5 + uVar16;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar10 + local_48._4_4_ + uVar15;
  uVar19 = uVar19 ^ uVar10;
  uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
  uVar13 = uVar13 + uVar19;
  uVar15 = uVar15 ^ uVar13;
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar10 = uVar10 + (int)local_48 + uVar15;
  uVar19 = uVar19 ^ uVar10;
  uVar19 = uVar19 << 0x18 | uVar19 >> 8;
  uVar13 = uVar13 + uVar19;
  uVar15 = uVar15 ^ uVar13;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar12 = uVar12 + uStack_50._4_4_ + uVar21;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar6 = uVar6 + uVar8;
  uVar21 = uVar21 ^ uVar6;
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar12 = uVar12 + (int)uStack_40 + uVar21;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar6 = uVar6 + uVar8;
  uVar21 = uVar21 ^ uVar6;
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar11 = uVar11 + (int)uStack_70 + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar11 = uVar11 + (int)uStack_60 + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar18 = uVar18 + local_68._4_4_ + uVar15;
  uVar14 = uVar14 ^ uVar18;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar6 = uVar6 + uVar14;
  uVar15 = uVar15 ^ uVar6;
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar18 = uVar18 + (int)uStack_50 + uVar15;
  uVar14 = uVar14 ^ uVar18;
  uVar14 = uVar14 << 0x18 | uVar14 >> 8;
  uVar6 = uVar6 + uVar14;
  uVar15 = uVar15 ^ uVar6;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar10 = uVar10 + (int)local_68 + uVar21;
  uVar16 = uVar16 ^ uVar10;
  uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
  uVar4 = uVar4 + uVar16;
  uVar21 = uVar21 ^ uVar4;
  uVar21 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar10 = uVar10 + (int)local_78 + uVar21;
  uVar16 = uVar16 ^ uVar10;
  uVar16 = uVar16 << 0x18 | uVar16 >> 8;
  uVar4 = uVar4 + uVar16;
  uVar21 = uVar21 ^ uVar4;
  uVar23 = uVar21 << 0x19 | uVar21 >> 7;
  uVar12 = uVar12 + uStack_40._4_4_ + uVar17;
  uVar19 = uVar19 ^ uVar12;
  uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
  uVar5 = uVar5 + uVar19;
  uVar17 = uVar17 ^ uVar5;
  uVar17 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar12 = uVar12 + (int)local_58 + uVar17;
  uVar19 = uVar19 ^ uVar12;
  uVar21 = uVar19 << 0x18 | uVar19 >> 8;
  uVar5 = uVar5 + uVar21;
  uVar17 = uVar17 ^ uVar5;
  uVar17 = uVar17 << 0x19 | uVar17 >> 7;
  uVar11 = uVar11 + local_58._4_4_ + uVar17;
  uVar14 = uVar14 ^ uVar11;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar4 = uVar4 + uVar14;
  uVar17 = uVar17 ^ uVar4;
  uVar17 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar11 = uVar11 + (int)local_78 + uVar17;
  uVar14 = uVar14 ^ uVar11;
  uVar14 = uVar14 << 0x18 | uVar14 >> 8;
  uVar4 = uVar4 + uVar14;
  uVar17 = uVar17 ^ uVar4;
  uVar19 = uVar17 << 0x19 | uVar17 >> 7;
  uVar18 = uVar18 + local_68._4_4_ + uVar9;
  uVar16 = uVar16 ^ uVar18;
  uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
  uVar5 = uVar5 + uVar16;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar18 = uVar18 + uStack_60._4_4_ + uVar9;
  uVar16 = uVar16 ^ uVar18;
  uVar16 = uVar16 << 0x18 | uVar16 >> 8;
  uVar5 = uVar5 + uVar16;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar10 + (int)uStack_70 + uVar15;
  uVar21 = uVar21 ^ uVar10;
  uVar17 = uVar21 << 0x10 | uVar21 >> 0x10;
  uVar13 = uVar13 + uVar17;
  uVar15 = uVar15 ^ uVar13;
  uVar15 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar10 = uVar10 + (int)local_68 + uVar15;
  uVar17 = uVar17 ^ uVar10;
  uVar21 = uVar17 << 0x18 | uVar17 >> 8;
  uVar13 = uVar13 + uVar21;
  uVar15 = uVar15 ^ uVar13;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar12 = uVar12 + (int)uStack_50 + uVar23;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar6 = uVar6 + uVar8;
  uVar23 = uVar23 ^ uVar6;
  uVar17 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar12 = uVar12 + uStack_40._4_4_ + uVar17;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar6 = uVar6 + uVar8;
  uVar17 = uVar17 ^ uVar6;
  uVar23 = uVar17 << 0x19 | uVar17 >> 7;
  uVar11 = uVar11 + (int)uStack_40 + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar11 = uVar11 + local_78._4_4_ + uVar9;
  uVar8 = uVar8 ^ uVar11;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar13 = uVar13 + uVar8;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar18 = uVar18 + uStack_50._4_4_ + uVar15;
  uVar14 = uVar14 ^ uVar18;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar6 = uVar6 + uVar14;
  uVar15 = uVar15 ^ uVar6;
  uVar17 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar18 = uVar18 + (int)local_48 + uVar17;
  uVar14 = uVar14 ^ uVar18;
  uVar15 = uVar14 << 0x18 | uVar14 >> 8;
  uVar6 = uVar6 + uVar15;
  uVar17 = uVar17 ^ uVar6;
  uVar17 = uVar17 << 0x19 | uVar17 >> 7;
  uVar10 = uVar10 + (int)uStack_60 + uVar23;
  uVar16 = uVar16 ^ uVar10;
  uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
  uVar4 = uVar4 + uVar16;
  uVar23 = uVar23 ^ uVar4;
  uVar23 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar10 = uVar10 + (int)local_58 + uVar23;
  uVar16 = uVar16 ^ uVar10;
  uVar14 = uVar16 << 0x18 | uVar16 >> 8;
  uVar4 = uVar4 + uVar14;
  uVar23 = uVar23 ^ uVar4;
  uVar24 = uVar23 << 0x19 | uVar23 >> 7;
  uVar12 = uVar12 + uStack_70._4_4_ + uVar19;
  uVar21 = uVar21 ^ uVar12;
  uVar21 = uVar21 << 0x10 | uVar21 >> 0x10;
  uVar5 = uVar5 + uVar21;
  uVar19 = uVar19 ^ uVar5;
  uVar19 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar16 = uVar12 + local_48._4_4_ + uVar19;
  uVar21 = uVar21 ^ uVar16;
  uVar23 = uVar21 << 0x18 | uVar21 >> 8;
  uVar5 = uVar5 + uVar23;
  uVar19 = uVar19 ^ uVar5;
  uVar12 = uVar19 << 0x19 | uVar19 >> 7;
  uVar11 = uVar11 + (int)uStack_70 + uVar12;
  uVar15 = uVar15 ^ uVar11;
  uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
  uVar4 = uVar4 + uVar15;
  uVar12 = uVar12 ^ uVar4;
  uVar19 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar12 = uVar11 + (int)local_48 + uVar19;
  uVar15 = uVar15 ^ uVar12;
  uVar21 = uVar15 << 0x18 | uVar15 >> 8;
  uVar4 = uVar4 + uVar21;
  uVar19 = uVar19 ^ uVar4;
  uVar20 = uVar19 << 0x19 | uVar19 >> 7;
  uVar18 = uVar18 + (int)uStack_60 + uVar9;
  uVar14 = uVar14 ^ uVar18;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar5 = uVar5 + uVar14;
  uVar9 = uVar9 ^ uVar5;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar11 = uVar18 + (int)uStack_50 + uVar9;
  uVar14 = uVar14 ^ uVar11;
  uVar19 = uVar14 << 0x18 | uVar14 >> 8;
  uVar5 = uVar5 + uVar19;
  uVar9 = uVar9 ^ uVar5;
  uVar18 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar10 + (int)local_78 + uVar17;
  uVar23 = uVar23 ^ uVar10;
  uVar15 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar13 = uVar13 + uVar15;
  uVar17 = uVar17 ^ uVar13;
  uVar14 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar9 = uVar10 + uVar14 + uStack_50._4_4_;
  uVar15 = uVar15 ^ uVar9;
  uVar22 = uVar15 << 0x18 | uVar15 >> 8;
  uVar13 = uVar13 + uVar22;
  uVar14 = uVar14 ^ uVar13;
  uVar23 = uVar14 << 0x19 | uVar14 >> 7;
  uVar10 = uVar16 + (int)local_58 + uVar24;
  uVar8 = uVar8 ^ uVar10;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar6 = uVar6 + uVar8;
  uVar24 = uVar24 ^ uVar6;
  uVar16 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar17 = uVar10 + uStack_70._4_4_ + uVar16;
  uVar8 = uVar8 ^ uVar17;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar6 = uVar6 + uVar8;
  uVar16 = uVar16 ^ uVar6;
  uVar24 = uVar16 << 0x19 | uVar16 >> 7;
  uVar12 = uVar12 + uVar18 + (int)local_68;
  uVar8 = uVar8 ^ uVar12;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar13 = uVar13 + uVar8;
  uVar18 = uVar18 ^ uVar13;
  uVar10 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar15 = uVar12 + local_48._4_4_ + uVar10;
  uVar8 = uVar8 ^ uVar15;
  uVar14 = uVar8 << 0x18 | uVar8 >> 8;
  uVar13 = uVar14 + uVar13;
  uVar10 = uVar13 ^ uVar10;
  uVar18 = uVar10 << 0x19 | uVar10 >> 7;
  uVar8 = uVar11 + uVar23 + uStack_60._4_4_;
  uVar21 = uVar21 ^ uVar8;
  uVar10 = uVar21 << 0x10 | uVar21 >> 0x10;
  uVar6 = uVar6 + uVar10;
  uVar23 = uVar23 ^ uVar6;
  uVar11 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar12 = uVar8 + local_68._4_4_ + uVar11;
  uVar10 = uVar12 ^ uVar10;
  uVar8 = uVar10 << 0x18 | uVar10 >> 8;
  uVar6 = uVar8 + uVar6;
  uVar11 = uVar6 ^ uVar11;
  uVar16 = uVar11 << 0x19 | uVar11 >> 7;
  uVar10 = uVar9 + uVar24 + uStack_40._4_4_;
  uVar19 = uVar19 ^ uVar10;
  uVar11 = uVar19 << 0x10 | uVar19 >> 0x10;
  uVar4 = uVar4 + uVar11;
  uVar24 = uVar24 ^ uVar4;
  uVar19 = uVar24 << 0x14 | uVar24 >> 0xc;
  uVar9 = uVar10 + (int)uStack_40 + uVar19;
  uVar11 = uVar9 ^ uVar11;
  uVar10 = uVar11 << 0x18 | uVar11 >> 8;
  uVar4 = uVar10 + uVar4;
  uVar19 = uVar19 ^ uVar4;
  uVar23 = uVar19 << 0x19 | uVar19 >> 7;
  uVar11 = uVar17 + local_78._4_4_ + uVar20;
  uVar22 = uVar22 ^ uVar11;
  uVar17 = uVar22 << 0x10 | uVar22 >> 0x10;
  uVar5 = uVar5 + uVar17;
  uVar20 = uVar20 ^ uVar5;
  uVar19 = uVar20 << 0x14 | uVar20 >> 0xc;
  uVar20 = uVar11 + uVar19 + local_58._4_4_;
  uVar17 = uVar20 ^ uVar17;
  uVar11 = uVar17 << 0x18 | uVar17 >> 8;
  uVar5 = uVar11 + uVar5;
  uVar19 = uVar5 ^ uVar19;
  uVar17 = uVar19 << 0x19 | uVar19 >> 7;
  uVar15 = uVar15 + (int)local_48 + uVar17;
  uVar8 = uVar8 ^ uVar15;
  uVar8 = uVar8 << 0x10 | uVar8 >> 0x10;
  uVar4 = uVar4 + uVar8;
  uVar17 = uVar17 ^ uVar4;
  uVar21 = uVar17 << 0x14 | uVar17 >> 0xc;
  uVar19 = uVar15 + uVar21 + local_68._4_4_;
  uVar8 = uVar19 ^ uVar8;
  uVar17 = uVar8 << 0x18 | uVar8 >> 8;
  uVar4 = uVar17 + uVar4;
  uVar21 = uVar4 ^ uVar21;
  uVar22 = uVar21 << 0x19 | uVar21 >> 7;
  uVar8 = uVar18 + uVar12 + local_78._4_4_;
  uVar10 = uVar10 ^ uVar8;
  uVar10 = uVar10 << 0x10 | uVar10 >> 0x10;
  uVar5 = uVar5 + uVar10;
  uVar18 = uVar18 ^ uVar5;
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar8 = uVar8 + uVar18 + uStack_40._4_4_;
  uVar10 = uVar8 ^ uVar10;
  uVar10 = uVar10 << 0x18 | uVar10 >> 8;
  uVar5 = uVar10 + uVar5;
  uVar18 = uVar5 ^ uVar18;
  uVar18 = uVar18 << 0x19 | uVar18 >> 7;
  uVar9 = uVar16 + uVar9 + (int)uStack_40;
  uVar11 = uVar11 ^ uVar9;
  uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
  uVar13 = uVar13 + uVar11;
  uVar16 = uVar16 ^ uVar13;
  uVar12 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar9 = uVar9 + uVar12 + local_48._4_4_;
  uVar11 = uVar9 ^ uVar11;
  uVar11 = uVar11 << 0x18 | uVar11 >> 8;
  uVar13 = uVar11 + uVar13;
  uVar12 = uVar13 ^ uVar12;
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar16 = uVar23 + uVar20 + (int)local_68;
  uVar14 = uVar14 ^ uVar16;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar6 = uVar6 + uVar14;
  uVar23 = uVar23 ^ uVar6;
  uVar15 = uVar23 << 0x14 | uVar23 >> 0xc;
  uVar16 = uVar16 + uVar15 + (int)uStack_50;
  uVar14 = uVar16 ^ uVar14;
  uVar14 = uVar14 << 0x18 | uVar14 >> 8;
  uVar6 = uVar6 + uVar14;
  uVar15 = uVar6 ^ uVar15;
  uVar20 = uVar15 << 0x19 | uVar15 >> 7;
  uVar15 = uVar18 + uVar19 + (int)local_78;
  uVar14 = uVar14 ^ uVar15;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar13 = uVar13 + uVar14;
  uVar18 = uVar18 ^ uVar13;
  uVar18 = uVar18 << 0x14 | uVar18 >> 0xc;
  uVar19 = uVar15 + uVar18 + uStack_60._4_4_;
  uVar14 = uVar19 ^ uVar14;
  uVar23 = uVar14 << 0x18 | uVar14 >> 8;
  uVar13 = uVar23 + uVar13;
  uVar18 = uVar13 ^ uVar18;
  uVar21 = uVar18 << 0x19 | uVar18 >> 7;
  uVar8 = uVar12 + uVar8 + (int)uStack_60;
  uVar17 = uVar17 ^ uVar8;
  uVar18 = uVar17 << 0x10 | uVar17 >> 0x10;
  uVar6 = uVar6 + uVar18;
  uVar12 = uVar12 ^ uVar6;
  uVar12 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar8 = uVar8 + uVar12 + uStack_70._4_4_;
  uVar18 = uVar8 ^ uVar18;
  uVar18 = uVar18 << 0x18 | uVar18 >> 8;
  uVar6 = uVar18 + uVar6;
  uVar12 = uVar6 ^ uVar12;
  uVar12 = uVar12 << 0x19 | uVar12 >> 7;
  uVar9 = uVar20 + uVar9 + local_58._4_4_;
  uVar10 = uVar10 ^ uVar9;
  uVar14 = uVar10 << 0x10 | uVar10 >> 0x10;
  uVar4 = uVar4 + uVar14;
  uVar20 = uVar20 ^ uVar4;
  uVar15 = uVar20 << 0x14 | uVar20 >> 0xc;
  uVar10 = uVar9 + uVar15 + (int)uStack_70;
  uVar14 = uVar10 ^ uVar14;
  uVar9 = uVar14 << 0x18 | uVar14 >> 8;
  uVar4 = uVar9 + uVar4;
  uVar15 = uVar4 ^ uVar15;
  uVar14 = uVar15 << 0x19 | uVar15 >> 7;
  uVar16 = uVar22 + uVar16 + (int)local_58;
  uVar11 = uVar11 ^ uVar16;
  uVar15 = uVar11 << 0x10 | uVar11 >> 0x10;
  uVar5 = uVar5 + uVar15;
  uVar22 = uVar22 ^ uVar5;
  uVar17 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar11 = uVar16 + uVar17 + uStack_50._4_4_;
  uVar15 = uVar11 ^ uVar15;
  uVar16 = uVar15 << 0x18 | uVar15 >> 8;
  uVar5 = uVar16 + uVar5;
  uVar17 = uVar5 ^ uVar17;
  uVar15 = uVar17 << 0x19 | uVar17 >> 7;
  uVar17 = uVar19 + uVar15 + local_48._4_4_;
  uVar18 = uVar18 ^ uVar17;
  uVar19 = uVar18 << 0x10 | uVar18 >> 0x10;
  uVar4 = uVar4 + uVar19;
  uVar15 = uVar15 ^ uVar4;
  uVar18 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar17 = uVar17 + uVar18 + uStack_50._4_4_;
  uVar19 = uVar17 ^ uVar19;
  uVar20 = uVar19 << 0x18 | uVar19 >> 8;
  uVar4 = uVar20 + uVar4;
  uVar18 = uVar4 ^ uVar18;
  uVar19 = uVar18 << 0x19 | uVar18 >> 7;
  uVar8 = uVar21 + uVar8 + uStack_60._4_4_;
  uVar9 = uVar9 ^ uVar8;
  uVar18 = uVar9 << 0x10 | uVar9 >> 0x10;
  uVar5 = uVar5 + uVar18;
  uVar21 = uVar21 ^ uVar5;
  uVar9 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar8 = uVar8 + uVar9 + (int)uStack_40;
  uVar18 = uVar8 ^ uVar18;
  uVar18 = uVar18 << 0x18 | uVar18 >> 8;
  uVar5 = uVar18 + uVar5;
  uVar9 = uVar5 ^ uVar9;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar12 + uVar10 + (int)local_48;
  uVar16 = uVar16 ^ uVar10;
  uVar16 = uVar16 << 0x10 | uVar16 >> 0x10;
  uVar13 = uVar13 + uVar16;
  uVar12 = uVar12 ^ uVar13;
  uVar15 = uVar12 << 0x14 | uVar12 >> 0xc;
  uVar10 = uVar10 + uVar15 + local_78._4_4_;
  uVar16 = uVar10 ^ uVar16;
  uVar12 = uVar16 << 0x18 | uVar16 >> 8;
  uVar13 = uVar12 + uVar13;
  uVar15 = uVar13 ^ uVar15;
  uVar16 = uVar15 << 0x19 | uVar15 >> 7;
  uVar11 = uVar14 + uVar11 + uStack_70._4_4_;
  uVar23 = uVar23 ^ uVar11;
  uVar15 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar6 = uVar6 + uVar15;
  uVar14 = uVar14 ^ uVar6;
  uVar21 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar11 = uVar11 + uVar21 + local_58._4_4_;
  uVar15 = uVar11 ^ uVar15;
  uVar14 = uVar15 << 0x18 | uVar15 >> 8;
  uVar6 = uVar6 + uVar14;
  uVar21 = uVar6 ^ uVar21;
  uVar22 = uVar21 << 0x19 | uVar21 >> 7;
  uVar15 = uVar9 + uVar17 + local_68._4_4_;
  uVar14 = uVar14 ^ uVar15;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar13 = uVar13 + uVar14;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar17 = uVar15 + uVar9 + (int)local_78;
  uVar14 = uVar17 ^ uVar14;
  uVar23 = uVar14 << 0x18 | uVar14 >> 8;
  uVar13 = uVar23 + uVar13;
  uVar9 = uVar13 ^ uVar9;
  uVar21 = uVar9 << 0x19 | uVar9 >> 7;
  uVar8 = uVar16 + uVar8 + uStack_40._4_4_;
  uVar20 = uVar20 ^ uVar8;
  uVar9 = uVar20 << 0x10 | uVar20 >> 0x10;
  uVar6 = uVar6 + uVar9;
  uVar16 = uVar16 ^ uVar6;
  uVar16 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar8 = uVar8 + uVar16 + (int)local_68;
  uVar9 = uVar8 ^ uVar9;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  uVar6 = uVar9 + uVar6;
  uVar16 = uVar6 ^ uVar16;
  uVar16 = uVar16 << 0x19 | uVar16 >> 7;
  uVar10 = uVar22 + uVar10 + (int)local_58;
  uVar18 = uVar18 ^ uVar10;
  uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
  uVar4 = uVar4 + uVar18;
  uVar22 = uVar22 ^ uVar4;
  uVar14 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar10 = uVar10 + uVar14 + (int)uStack_60;
  uVar18 = uVar10 ^ uVar18;
  uVar18 = uVar18 << 0x18 | uVar18 >> 8;
  uVar4 = uVar18 + uVar4;
  uVar14 = uVar4 ^ uVar14;
  uVar14 = uVar14 << 0x19 | uVar14 >> 7;
  uVar11 = uVar19 + uVar11 + (int)uStack_70;
  uVar12 = uVar12 ^ uVar11;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  uVar5 = uVar5 + uVar12;
  uVar19 = uVar19 ^ uVar5;
  uVar15 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar11 = uVar11 + uVar15 + (int)uStack_50;
  uVar12 = uVar11 ^ uVar12;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  uVar5 = uVar12 + uVar5;
  uVar15 = uVar5 ^ uVar15;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar17 = uVar17 + uVar15 + (int)uStack_60;
  uVar9 = uVar9 ^ uVar17;
  uVar19 = uVar9 << 0x10 | uVar9 >> 0x10;
  uVar4 = uVar4 + uVar19;
  uVar15 = uVar15 ^ uVar4;
  uVar9 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar17 = uVar17 + uVar9 + uStack_40._4_4_;
  uVar19 = uVar17 ^ uVar19;
  uVar20 = uVar19 << 0x18 | uVar19 >> 8;
  uVar4 = uVar20 + uVar4;
  uVar9 = uVar4 ^ uVar9;
  uVar19 = uVar9 << 0x19 | uVar9 >> 7;
  uVar8 = uVar21 + uVar8 + (int)uStack_40;
  uVar18 = uVar18 ^ uVar8;
  uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
  uVar5 = uVar5 + uVar18;
  uVar21 = uVar21 ^ uVar5;
  uVar9 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar8 = uVar8 + uVar9 + local_58._4_4_;
  uVar18 = uVar8 ^ uVar18;
  uVar18 = uVar18 << 0x18 | uVar18 >> 8;
  uVar5 = uVar18 + uVar5;
  uVar9 = uVar5 ^ uVar9;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar16 + uVar10 + uStack_50._4_4_;
  uVar12 = uVar12 ^ uVar10;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  uVar13 = uVar13 + uVar12;
  uVar16 = uVar16 ^ uVar13;
  uVar16 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar10 = uVar10 + uVar16 + uStack_70._4_4_;
  uVar12 = uVar10 ^ uVar12;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  uVar13 = uVar12 + uVar13;
  uVar16 = uVar13 ^ uVar16;
  uVar16 = uVar16 << 0x19 | uVar16 >> 7;
  uVar11 = uVar14 + uVar11 + (int)local_78;
  uVar23 = uVar23 ^ uVar11;
  uVar15 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar6 = uVar6 + uVar15;
  uVar14 = uVar14 ^ uVar6;
  uVar21 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar11 = uVar11 + uVar21 + (int)local_58;
  uVar15 = uVar11 ^ uVar15;
  uVar14 = uVar15 << 0x18 | uVar15 >> 8;
  uVar6 = uVar6 + uVar14;
  uVar21 = uVar6 ^ uVar21;
  uVar22 = uVar21 << 0x19 | uVar21 >> 7;
  uVar15 = uVar9 + uVar17 + (int)local_48;
  uVar14 = uVar14 ^ uVar15;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar13 = uVar13 + uVar14;
  uVar9 = uVar9 ^ uVar13;
  uVar9 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar17 = uVar15 + uVar9 + (int)uStack_70;
  uVar14 = uVar17 ^ uVar14;
  uVar23 = uVar14 << 0x18 | uVar14 >> 8;
  uVar13 = uVar23 + uVar13;
  uVar9 = uVar13 ^ uVar9;
  uVar21 = uVar9 << 0x19 | uVar9 >> 7;
  uVar8 = uVar16 + uVar8 + local_48._4_4_;
  uVar20 = uVar20 ^ uVar8;
  uVar9 = uVar20 << 0x10 | uVar20 >> 0x10;
  uVar6 = uVar6 + uVar9;
  uVar16 = uVar16 ^ uVar6;
  uVar16 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar8 = uVar8 + uVar16 + uStack_60._4_4_;
  uVar9 = uVar8 ^ uVar9;
  uVar9 = uVar9 << 0x18 | uVar9 >> 8;
  uVar6 = uVar9 + uVar6;
  uVar16 = uVar6 ^ uVar16;
  uVar16 = uVar16 << 0x19 | uVar16 >> 7;
  uVar10 = uVar22 + uVar10 + local_78._4_4_;
  uVar18 = uVar18 ^ uVar10;
  uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
  uVar4 = uVar4 + uVar18;
  uVar22 = uVar22 ^ uVar4;
  uVar14 = uVar22 << 0x14 | uVar22 >> 0xc;
  uVar10 = uVar10 + uVar14 + (int)local_68;
  uVar18 = uVar10 ^ uVar18;
  uVar18 = uVar18 << 0x18 | uVar18 >> 8;
  uVar4 = uVar18 + uVar4;
  uVar14 = uVar4 ^ uVar14;
  uVar14 = uVar14 << 0x19 | uVar14 >> 7;
  uVar11 = uVar19 + uVar11 + (int)uStack_50;
  uVar12 = uVar12 ^ uVar11;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  uVar5 = uVar5 + uVar12;
  uVar19 = uVar19 ^ uVar5;
  uVar15 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar11 = uVar11 + uVar15 + local_68._4_4_;
  uVar12 = uVar11 ^ uVar12;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  uVar5 = uVar12 + uVar5;
  uVar15 = uVar5 ^ uVar15;
  uVar15 = uVar15 << 0x19 | uVar15 >> 7;
  uVar17 = uVar17 + uVar15 + (int)uStack_50;
  uVar9 = uVar9 ^ uVar17;
  uVar19 = uVar9 << 0x10 | uVar9 >> 0x10;
  uVar4 = uVar4 + uVar19;
  uVar15 = uVar15 ^ uVar4;
  uVar9 = uVar15 << 0x14 | uVar15 >> 0xc;
  uVar17 = uVar17 + uVar9 + (int)uStack_70;
  uVar19 = uVar17 ^ uVar19;
  uVar20 = uVar19 << 0x18 | uVar19 >> 8;
  uVar4 = uVar20 + uVar4;
  uVar9 = uVar4 ^ uVar9;
  uVar19 = uVar9 << 0x19 | uVar9 >> 7;
  uVar8 = uVar21 + uVar8 + (int)local_58;
  uVar18 = uVar18 ^ uVar8;
  uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
  uVar5 = uVar5 + uVar18;
  uVar21 = uVar21 ^ uVar5;
  uVar9 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar8 = uVar8 + uVar9 + (int)local_68;
  uVar18 = uVar8 ^ uVar18;
  uVar18 = uVar18 << 0x18 | uVar18 >> 8;
  uVar5 = uVar18 + uVar5;
  uVar9 = uVar5 ^ uVar9;
  uVar9 = uVar9 << 0x19 | uVar9 >> 7;
  uVar10 = uVar16 + uVar10 + uStack_60._4_4_;
  uVar12 = uVar12 ^ uVar10;
  uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
  uVar13 = uVar13 + uVar12;
  uVar16 = uVar16 ^ uVar13;
  uVar16 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar10 = uVar10 + uVar16 + (int)uStack_60;
  uVar12 = uVar10 ^ uVar12;
  uVar12 = uVar12 << 0x18 | uVar12 >> 8;
  uVar13 = uVar12 + uVar13;
  uVar16 = uVar13 ^ uVar16;
  uVar16 = uVar16 << 0x19 | uVar16 >> 7;
  uVar11 = uVar14 + uVar11 + local_78._4_4_;
  uVar23 = uVar23 ^ uVar11;
  uVar15 = uVar23 << 0x10 | uVar23 >> 0x10;
  uVar6 = uVar6 + uVar15;
  uVar14 = uVar14 ^ uVar6;
  uVar21 = uVar14 << 0x14 | uVar14 >> 0xc;
  uVar11 = uVar11 + uVar21 + local_68._4_4_;
  uVar15 = uVar11 ^ uVar15;
  uVar14 = uVar15 << 0x18 | uVar15 >> 8;
  uVar6 = uVar6 + uVar14;
  uVar21 = uVar6 ^ uVar21;
  uVar21 = uVar21 << 0x19 | uVar21 >> 7;
  uVar15 = uVar9 + uVar17 + uStack_40._4_4_;
  uVar14 = uVar14 ^ uVar15;
  uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
  uVar13 = uVar13 + uVar14;
  uVar9 = uVar9 ^ uVar13;
  uVar17 = uVar9 << 0x14 | uVar9 >> 0xc;
  uVar9 = uVar15 + uVar17 + uStack_50._4_4_;
  uVar14 = uVar9 ^ uVar14;
  uVar14 = uVar14 << 0x18 | uVar14 >> 8;
  uVar13 = uVar14 + uVar13;
  uVar17 = uVar13 ^ uVar17;
  uVar8 = uVar16 + uVar8 + local_58._4_4_;
  uVar20 = uVar20 ^ uVar8;
  uVar15 = uVar20 << 0x10 | uVar20 >> 0x10;
  uVar6 = uVar6 + uVar15;
  uVar16 = uVar16 ^ uVar6;
  uVar16 = uVar16 << 0x14 | uVar16 >> 0xc;
  uVar8 = uVar8 + uVar16 + (int)uStack_40;
  _local_b8 = CONCAT44(uVar8,uVar9);
  uVar8 = uVar8 ^ uVar15;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  uVar6 = uVar8 + uVar6;
  _uStack_90 = CONCAT44(uVar6,uVar13);
  uVar6 = uVar6 ^ uVar16;
  uVar10 = uVar21 + uVar10 + uStack_70._4_4_;
  uVar18 = uVar18 ^ uVar10;
  uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
  uVar4 = uVar4 + uVar18;
  uVar21 = uVar21 ^ uVar4;
  uVar9 = uVar21 << 0x14 | uVar21 >> 0xc;
  uVar10 = uVar10 + uVar9 + (int)local_48;
  uVar18 = uVar10 ^ uVar18;
  uVar18 = uVar18 << 0x18 | uVar18 >> 8;
  _local_88 = CONCAT44(uVar18,uVar8);
  uVar18 = uVar18 + uVar4;
  uVar9 = uVar18 ^ uVar9;
  _uStack_a0 = CONCAT44(uVar9 << 0x19 | uVar9 >> 7,uVar6 << 0x19 | uVar6 >> 7);
  uVar8 = uVar19 + uVar11 + local_48._4_4_;
  uVar12 = uVar12 ^ uVar8;
  uVar9 = uVar12 << 0x10 | uVar12 >> 0x10;
  uVar5 = uVar5 + uVar9;
  uVar19 = uVar19 ^ uVar5;
  uVar11 = uVar19 << 0x14 | uVar19 >> 0xc;
  uVar8 = uVar8 + uVar11 + (int)local_78;
  _uStack_b0 = CONCAT44(uVar8,uVar10);
  uVar8 = uVar8 ^ uVar9;
  uVar8 = uVar8 << 0x18 | uVar8 >> 8;
  _uStack_80 = CONCAT44(uVar14,uVar8);
  uVar8 = uVar8 + uVar5;
  _local_98 = CONCAT44(uVar8,uVar18);
  uVar8 = uVar8 ^ uVar11;
  _local_a8 = CONCAT44(uVar17 << 0x19 | uVar17 >> 7,uVar8 << 0x19 | uVar8 >> 7);
  lVar7 = 0;
  do {
    uVar3 = *(ulong *)(S->h + lVar7 + 2);
    uVar2 = *(ulong *)(&uStack_b0 + lVar7);
    uVar1 = *(ulong *)(&uStack_90 + lVar7);
    *(ulong *)(S->h + lVar7) =
         *(ulong *)(S->h + lVar7) ^ *(ulong *)(&local_b8 + lVar7) ^ *(ulong *)(&local_98 + lVar7);
    *(ulong *)(S->h + lVar7 + 2) = uVar3 ^ uVar2 ^ uVar1;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blake2s_compress( blake2s_state *S, const uint8_t in[BLAKE2S_BLOCKBYTES] )
{
  uint32_t m[16];
  uint32_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load32( in + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2s_IV[0];
  v[ 9] = blake2s_IV[1];
  v[10] = blake2s_IV[2];
  v[11] = blake2s_IV[3];
  v[12] = S->t[0] ^ blake2s_IV[4];
  v[13] = S->t[1] ^ blake2s_IV[5];
  v[14] = S->f[0] ^ blake2s_IV[6];
  v[15] = S->f[1] ^ blake2s_IV[7];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}